

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  sqlite3_xauth p_Var1;
  char *zOld;
  Select *p;
  FKey *pFVar2;
  char *zLeft;
  Index *pIVar3;
  TriggerStep *pTVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uchar *zSql;
  uchar *zDatabase;
  uchar *zName;
  i64 iVar8;
  uchar *zNew;
  i64 iVar9;
  i64 iVar10;
  Table *pTVar11;
  Expr *pExpr;
  Table *pTVar12;
  uint uVar13;
  sColMap *pPtr;
  long lVar14;
  long lVar15;
  Index **ppIVar16;
  TriggerStep **ppTVar17;
  RenameCtx sCtx;
  Walker local_208;
  Parse sParse;
  
  db = context->pOut->db;
  zSql = sqlite3_value_text(*argv);
  zDatabase = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  iVar8 = sqlite3VdbeIntValue(argv[5]);
  zNew = sqlite3_value_text(argv[6]);
  iVar9 = sqlite3VdbeIntValue(argv[7]);
  iVar10 = sqlite3VdbeIntValue(argv[8]);
  uVar13 = (uint)iVar8;
  if (((int)uVar13 < 0 || zNew == (uchar *)0x0) || (zName == (uchar *)0x0 || zSql == (uchar *)0x0))
  {
    return;
  }
  p_Var1 = db->xAuth;
  sqlite3BtreeEnterAll(db);
  pTVar11 = sqlite3FindTable(db,(char *)zName,(char *)zDatabase);
  if ((pTVar11 == (Table *)0x0) || ((int)pTVar11->nCol <= (int)uVar13)) {
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTVar11->aCol[uVar13 & 0x7fffffff].zCnName;
  sCtx.pTab = (Table *)0x0;
  sCtx.zOld = (char *)0x0;
  sCtx.pList = (RenameToken *)0x0;
  uVar5 = 0xffffffff;
  if (uVar13 != (int)pTVar11->iPKey) {
    uVar5 = uVar13;
  }
  sCtx._8_8_ = (ulong)uVar5 << 0x20;
  db->xAuth = (sqlite3_xauth)0x0;
  iVar6 = renameParseSql(&sParse,(char *)zDatabase,db,(char *)zSql,(int)iVar10);
  pTVar12 = sParse.pNewTable;
  local_208.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_208.walkerDepth = 0;
  local_208.eCode = 0;
  local_208.mWFlags = 0;
  local_208.xExprCallback = renameColumnExprCb;
  local_208.xSelectCallback = renameColumnSelectCb;
  sCtx.pTab = pTVar11;
  local_208.pParse = &sParse;
  local_208.u.pNC = (NameContext *)&sCtx;
  if (iVar6 == 0) {
    if (sParse.pNewTable == (Table *)0x0) {
      if (sParse.pNewIndex == (Index *)0x0) {
        iVar6 = renameResolveTrigger(&sParse);
        if (iVar6 != 0) goto LAB_0018de12;
        ppTVar17 = &(sParse.pNewTrigger)->step_list;
        while (pTVar4 = *ppTVar17, pTVar4 != (TriggerStep *)0x0) {
          if ((pTVar4->zTarget != (char *)0x0) &&
             (pTVar12 = sqlite3LocateTable(&sParse,0,pTVar4->zTarget,(char *)zDatabase),
             pTVar12 == pTVar11)) {
            if (pTVar4->pUpsert != (Upsert *)0x0) {
              renameColumnElistNames(&sParse,&sCtx,pTVar4->pUpsert->pUpsertSet,zOld);
            }
            renameColumnIdlistNames(&sParse,&sCtx,pTVar4->pIdList,zOld);
            renameColumnElistNames(&sParse,&sCtx,pTVar4->pExprList,zOld);
          }
          ppTVar17 = &pTVar4->pNext;
        }
        if (sParse.pTriggerTab == pTVar11) {
          renameColumnIdlistNames(&sParse,&sCtx,(sParse.pNewTrigger)->pColumns,zOld);
        }
        renameWalkTrigger(&local_208,sParse.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_208,(sParse.pNewIndex)->aColExpr);
        sqlite3WalkExpr(&local_208,(sParse.pNewIndex)->pPartIdxWhere);
      }
    }
    else if ((sParse.pNewTable)->eTabType == '\0') {
      iVar6 = sqlite3_stricmp((char *)zName,(sParse.pNewTable)->zName);
      sCtx.pTab = pTVar12;
      if (iVar6 == 0) {
        if ((int)uVar13 < (int)pTVar12->nCol) {
          renameTokenFind(&sParse,&sCtx,pTVar12->aCol[uVar13 & 0x7fffffff].zCnName);
          pTVar12 = sParse.pNewTable;
        }
        if ((long)sCtx._8_8_ < 0) {
          renameTokenFind(&sParse,&sCtx,&pTVar12->iPKey);
          pTVar12 = sParse.pNewTable;
        }
        sqlite3WalkExprList(&local_208,pTVar12->pCheck);
        ppIVar16 = &(sParse.pNewTable)->pIndex;
        while (pIVar3 = *ppIVar16, pIVar3 != (Index *)0x0) {
          sqlite3WalkExprList(&local_208,pIVar3->aColExpr);
          ppIVar16 = &pIVar3->pNext;
        }
        ppIVar16 = &sParse.pNewIndex;
        while (pIVar3 = *ppIVar16, pIVar3 != (Index *)0x0) {
          sqlite3WalkExprList(&local_208,pIVar3->aColExpr);
          ppIVar16 = &pIVar3->pNext;
        }
        lVar15 = 0;
        for (lVar14 = 0; pTVar12 = sParse.pNewTable, lVar14 < (sParse.pNewTable)->nCol;
            lVar14 = lVar14 + 1) {
          pExpr = sqlite3ColumnExpr(sParse.pNewTable,
                                    (Column *)((long)&(sParse.pNewTable)->aCol->zCnName + lVar15));
          sqlite3WalkExpr(&local_208,pExpr);
          lVar15 = lVar15 + 0x10;
        }
      }
      pFVar2 = (FKey *)&pTVar12->u;
      while (pFVar2 = pFVar2->pNextFrom, pFVar2 != (FKey *)0x0) {
        pPtr = pFVar2->aCol;
        for (lVar14 = 0; lVar14 < pFVar2->nCol; lVar14 = lVar14 + 1) {
          if ((iVar6 == 0) && (pPtr->iFrom == uVar13)) {
            renameTokenFind(&sParse,&sCtx,pPtr);
          }
          iVar7 = sqlite3_stricmp(pFVar2->zTo,(char *)zName);
          if (iVar7 == 0) {
            zLeft = pPtr->zCol;
            iVar7 = sqlite3_stricmp(zLeft,zOld);
            if (iVar7 == 0) {
              renameTokenFind(&sParse,&sCtx,zLeft);
            }
          }
          pPtr = pPtr + 1;
        }
      }
    }
    else if ((sParse.pNewTable)->eTabType == '\x02') {
      p = *(Select **)&(sParse.pNewTable)->u;
      p->selFlags = p->selFlags & 0xffdfffff;
      sParse.rc = 0;
      sqlite3SelectPrep(&sParse,p,(NameContext *)0x0);
      iVar6 = sParse.rc;
      if (db->mallocFailed != '\0') {
        iVar6 = 7;
      }
      if (iVar6 != 0) goto LAB_0018de12;
      sqlite3WalkSelect(&local_208,p);
    }
    iVar6 = renameEditSql(context,&sCtx,(char *)zSql,(char *)zNew,(int)iVar9);
  }
LAB_0018de12:
  if (iVar6 != 0) {
    if ((iVar6 == 1) && ((db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(context,*argv);
    }
    else if (sParse.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(context,iVar6);
    }
    else {
      renameColumnParseError(context,"",argv[1],argv[2],&sParse);
    }
  }
  renameParseCleanup(&sParse);
  renameTokenFree(db,sCtx.pList);
  db->xAuth = p_Var1;
  sqlite3BtreeLeaveAll(db);
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zCnName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    if( IsView(sParse.pNewTable) ){
      Select *pSelect = sParse.pNewTable->u.view.pSelect;
      pSelect->selFlags &= ~SF_View;
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else if( IsOrdinaryTable(sParse.pNewTable) ){
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        if( iCol<sParse.pNewTable->nCol ){
          renameTokenFind(
              &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zCnName
          );
        }
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
        for(pIdx=sParse.pNewIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
        for(i=0; i<sParse.pNewTable->nCol; i++){
          Expr *pExpr = sqlite3ColumnExpr(sParse.pNewTable,
                                                  &sParse.pNewTable->aCol[i]);
          sqlite3WalkExpr(&sWalker, pExpr);
        }
#endif
      }

      assert( IsOrdinaryTable(sParse.pNewTable) );
      for(pFKey=sParse.pNewTable->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse);
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
      sqlite3_result_value(context, argv[0]);
    }else if( sParse.zErrMsg ){
      renameColumnParseError(context, "", argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}